

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError getstrn(char **str,char *val,size_t len,_Bool allowblank)

{
  char *pcVar1;
  _Bool allowblank_local;
  size_t len_local;
  char *val_local;
  char **str_local;
  
  if (*str != (char *)0x0) {
    free(*str);
    *str = (char *)0x0;
  }
  if (val != (char *)0x0) {
    if ((!allowblank) && (*val == '\0')) {
      return PARAM_BLANK_STRING;
    }
    pcVar1 = (char *)malloc(len + 1);
    *str = pcVar1;
    if (*str == (char *)0x0) {
      return PARAM_NO_MEM;
    }
    memcpy(*str,val,len);
    (*str)[len] = '\0';
  }
  return PARAM_OK;
}

Assistant:

static ParameterError getstrn(char **str, const char *val,
                              size_t len, bool allowblank)
{
  if(*str) {
    free(*str);
    *str = NULL;
  }
  if(val) {
    if(!allowblank && !val[0])
      return PARAM_BLANK_STRING;

    *str = malloc(len + 1);
    if(!*str)
      return PARAM_NO_MEM;

    memcpy(*str, val, len);
    (*str)[len] = 0; /* null terminate */
  }
  return PARAM_OK;
}